

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O0

byte_view __thiscall winmd::reader::database::get_blob(database *this,uint32_t index)

{
  uint uVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  byte_view bVar4;
  uint8_t *byte;
  uint8_t *__end2;
  uint8_t *__begin2;
  byte_view *local_78;
  byte_view *__range2;
  uint32_t blob_size;
  allocator<char> local_59;
  string local_58;
  uint32_t local_38;
  byte local_31;
  uint32_t blob_size_bytes;
  uchar initial_byte;
  byte_view view;
  uint32_t index_local;
  database *this_local;
  
  byte_view::seek((byte_view *)&blob_size_bytes,index + 0x650);
  pbVar2 = byte_view::as<unsigned_char>((byte_view *)&blob_size_bytes,0);
  local_31 = *pbVar2;
  local_38 = 0;
  uVar1 = (uint)(local_31 >> 5);
  if (uVar1 < 4) {
    local_38 = 1;
    local_31 = local_31 & 0x7f;
  }
  else if (uVar1 - 4 < 2) {
    local_38 = 2;
    local_31 = local_31 & 0x3f;
  }
  else {
    if (uVar1 != 6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Invalid blob encoding",&local_59);
      impl::throw_invalid(&local_58);
    }
    local_38 = 4;
    local_31 = local_31 & 0x1f;
  }
  __range2._0_4_ = (uint)local_31;
  byte_view::sub((byte_view *)&__begin2,(uint32_t)&blob_size_bytes,1);
  local_78 = (byte_view *)&__begin2;
  __end2 = byte_view::begin(local_78);
  puVar3 = byte_view::end(local_78);
  for (; __end2 != puVar3; __end2 = __end2 + 1) {
    __range2._0_4_ = (uint)__range2 * 0x100 + (uint)*__end2;
  }
  bVar4 = byte_view::sub((byte_view *)this,(uint32_t)&blob_size_bytes,local_38);
  bVar4.m_first = (uint8_t *)this;
  return bVar4;
}

Assistant:

byte_view get_blob(uint32_t const index) const
        {
            auto view = m_blobs.seek(index);
            auto initial_byte = view.as<uint8_t>();
            uint32_t blob_size_bytes{};

            switch (initial_byte >> 5)
            {
            case 0:
            case 1:
            case 2:
            case 3:
                blob_size_bytes = 1;
                initial_byte &= 0x7f;
                break;

            case 4:
            case 5:
                blob_size_bytes = 2;
                initial_byte &= 0x3f;
                break;

            case 6:
                blob_size_bytes = 4;
                initial_byte &= 0x1f;
                break;

            default:
                impl::throw_invalid("Invalid blob encoding");
            }

            uint32_t blob_size{ initial_byte };

            for (auto&& byte : view.sub(1, blob_size_bytes - 1))
            {
                blob_size = (blob_size << 8) + byte;
            }

            return { view.sub(blob_size_bytes, blob_size) };
        }